

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<4,_11,_11>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 *puVar1;
  bool bVar2;
  undefined8 in_RAX;
  bool bVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  float *pfVar7;
  int col;
  long lVar8;
  int col_1;
  undefined8 *puVar9;
  int c;
  undefined4 uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float afStack_88 [2];
  Matrix<float,_2,_4> retVal;
  undefined1 local_58 [8];
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38 [8];
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  int aiStack_18 [5];
  undefined4 uStack_4;
  
  puVar1 = (undefined8 *)((long)local_38 + 4);
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    puVar5 = (undefined8 *)local_38;
    bVar2 = true;
    do {
      bVar3 = bVar2;
      lVar8 = 0;
      do {
        uVar10 = 0x3f800000;
        if (lVar4 != lVar8) {
          uVar10 = 0;
        }
        *(undefined4 *)(puVar5 + lVar8) = uVar10;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      lVar4 = 1;
      puVar5 = puVar1;
      bVar2 = false;
    } while (bVar3);
    local_38 = (undefined1  [8])*(undefined8 *)evalCtx->in[0].m_data;
    uStack_30 = *(undefined8 *)evalCtx->in[1].m_data;
    local_28 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_20 = *(undefined8 *)evalCtx->in[3].m_data;
  }
  else {
    local_28 = 0;
    uStack_20 = 0;
    local_38 = (undefined1  [8])0x0;
    uStack_30 = 0;
    lVar4 = 0;
    puVar5 = (undefined8 *)local_38;
    bVar2 = true;
    do {
      bVar3 = bVar2;
      lVar8 = 0;
      do {
        *(undefined4 *)(puVar5 + lVar8) =
             *(undefined4 *)((long)&sr::(anonymous_namespace)::s_constInMat4x2 + lVar4 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      lVar4 = 0x10;
      puVar5 = puVar1;
      bVar2 = false;
    } while (bVar3);
  }
  puVar5 = (undefined8 *)((long)local_58 + 4);
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    puVar6 = (undefined8 *)local_58;
    bVar2 = true;
    do {
      bVar3 = bVar2;
      lVar8 = 0;
      do {
        uVar10 = 0x3f800000;
        if (lVar4 != lVar8) {
          uVar10 = 0;
        }
        *(undefined4 *)(puVar6 + lVar8) = uVar10;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      lVar4 = 1;
      puVar6 = puVar5;
      bVar2 = false;
    } while (bVar3);
    local_58 = (undefined1  [8])*(undefined8 *)evalCtx->in[0].m_data;
    uStack_50 = *(undefined8 *)evalCtx->in[1].m_data;
    local_48 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_40 = *(undefined8 *)evalCtx->in[3].m_data;
  }
  else {
    local_48 = 0;
    uStack_40 = 0;
    local_58 = (undefined1  [8])0x0;
    uStack_50 = 0;
    lVar4 = 0;
    puVar6 = (undefined8 *)local_58;
    bVar2 = true;
    do {
      bVar3 = bVar2;
      lVar8 = 0;
      do {
        *(undefined4 *)(puVar6 + lVar8) = *(undefined4 *)((long)&DAT_00af0b40 + lVar8 * 4 + lVar4);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      lVar4 = 0x10;
      puVar6 = puVar5;
      bVar2 = false;
    } while (bVar3);
  }
  retVal.m_data.m_data[2].m_data[0] = 0.0;
  retVal.m_data.m_data[2].m_data[1] = 0.0;
  afStack_88[0] = 0.0;
  afStack_88[1] = 0.0;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  lVar4 = 0;
  pfVar7 = afStack_88;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    lVar8 = 0;
    do {
      fVar11 = 1.0;
      if (lVar4 != lVar8) {
        fVar11 = 0.0;
      }
      pfVar7[lVar8 * 2] = fVar11;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    lVar4 = 1;
    pfVar7 = afStack_88 + 1;
    bVar2 = false;
  } while (bVar3);
  pfVar7 = afStack_88;
  puVar6 = (undefined8 *)local_58;
  puVar9 = (undefined8 *)local_38;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    lVar4 = 0;
    do {
      pfVar7[lVar4 * 2] = *(float *)(puVar9 + lVar4) * *(float *)(puVar6 + lVar4);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    pfVar7 = afStack_88 + 1;
    puVar6 = puVar5;
    puVar9 = puVar1;
    bVar2 = false;
  } while (bVar3);
  fVar12 = retVal.m_data.m_data[2].m_data[0] + afStack_88[0] + afStack_88[1];
  fVar13 = retVal.m_data.m_data[2].m_data[1] +
           retVal.m_data.m_data[0].m_data[1] + retVal.m_data.m_data[0].m_data[0];
  retVal.m_data.m_data[3].m_data[0] = fVar12;
  retVal.m_data.m_data[3].m_data[1] = fVar13;
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  stack0xfffffffffffffff8 = CONCAT44((int)((ulong)in_RAX >> 0x20),2);
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar4]] = retVal.m_data.m_data[2].m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}